

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O3

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<double> *original_costs,
            double cost_constant)

{
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  init_policy_type iVar4;
  context *ctx;
  context *ctx_00;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  unique_ptr<double[],_std::default_delete<double[]>_> P;
  unique_ptr<double[],_std::default_delete<double[]>_> uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  rep rVar13;
  long lVar14;
  ulong uVar15;
  random_engine *rng;
  int iVar16;
  pnm_observer *x_optimistic;
  pnm_observer *x_pessimistic;
  long lVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  string_view filename;
  compute_order compute;
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  slv;
  pnm_observer obs;
  double local_3e0;
  undefined1 local_3d0 [24];
  double local_3b8;
  pointer local_3b0;
  default_cost_type<double> *local_3a8;
  double local_3a0;
  int local_394;
  double local_390;
  double local_388;
  double local_380;
  cost_type local_378;
  double local_368;
  double local_360;
  long local_358;
  compute_order local_350;
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  local_318;
  pnm_observer local_288;
  undefined1 extraout_var [56];
  
  auVar21 = ZEXT1664(ZEXT816(0));
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar21;
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = auVar21;
  __return_storage_ptr__->strings = (string_buffer_ptr)auVar21._0_16_;
  (__return_storage_ptr__->method)._M_len = SUB168(auVar21._16_16_,0);
  (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar21._16_16_,8);
  (__return_storage_ptr__->affected_vars).names =
       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )auVar21._32_24_;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar21._56_8_;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_3d0._16_8_ = __return_storage_ptr__;
  local_3a0 = cost_constant;
  bit_array_impl::bit_array_impl((bit_array_impl *)local_3d0,variables);
  ctx = this->m_ctx;
  normalize_costs<double,baryonyx::itm::default_cost_type<double>>
            ((itm *)&local_378,ctx,original_costs,this->m_rng,variables);
  local_388 = (ctx->parameters).kappa_step;
  local_3b0 = (pointer)(ctx->parameters).delta;
  local_380 = (ctx->parameters).kappa_max;
  local_390 = (ctx->parameters).alpha;
  local_3b8 = (ctx->parameters).theta;
  if ((double)local_3b0 < 0.0) {
    ctx_00 = this->m_ctx;
    local_288.m_pi_obs._0_8_ = local_3b8;
    info<>(ctx_00,"  - delta not defined, compute it:\n");
    if (variables == 0) {
      auVar18 = ZEXT816(0x7fefffffffffffff);
    }
    else {
      auVar23._8_8_ = 0x7fffffffffffffff;
      auVar23._0_8_ = 0x7fffffffffffffff;
      uVar15 = 0;
      auVar1 = ZEXT816(0x7fefffffffffffff);
      do {
        auVar26._8_8_ = 0;
        auVar26._0_8_ =
             *(double *)
              ((long)local_378.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + uVar15 * 8);
        uVar15 = uVar15 + 1;
        auVar18 = vandpd_avx(auVar26,auVar23);
        uVar6 = vcmppd_avx512vl(auVar26,ZEXT816(0) << 0x40,4);
        uVar7 = vcmppd_avx512vl(auVar18,auVar1,1);
        bVar8 = (byte)uVar6 & 3 & (byte)uVar7 & 3;
        auVar18._0_8_ =
             (ulong)(bVar8 & 1) * auVar18._0_8_ + (ulong)!(bool)(bVar8 & 1) * auVar1._0_8_;
        auVar18._8_8_ = auVar1._8_8_;
        auVar1 = auVar18;
      } while ((uint)variables != uVar15);
    }
    local_318.super_debug_logger<true>.ofs = auVar18._0_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_3b8;
    auVar18 = vfnmadd132sd_fma(auVar18,auVar18,auVar1);
    local_350.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = auVar18._0_8_;
    info<double,double,double>
              (ctx_00,"    - delta={} (min normalized cost:{} / theta: {})\n",(double *)&local_350,
               (double *)&local_318,(double *)&local_288);
    local_3b0 = local_350.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  local_358 = (long)(ctx->parameters).w;
  local_360 = (ctx->parameters).pushing_k_factor;
  local_368 = (ctx->parameters).pushing_objective_amplifier;
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  ::solver_inequalities_101coeff
            (&local_318,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_378,constraints);
  compute_order::compute_order(&local_350,(ctx->parameters).order,variables);
  dVar20 = (this->m_ctx->parameters).init_policy_random;
  local_288.m_pi_obs.constraints = 0;
  local_288.m_pi_obs._4_4_ = 0;
  local_288.m_pi_obs.m_pnm.m_buffer._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
  iVar4 = (ctx->parameters).init_policy;
  local_394 = variables;
  if (iVar4 == bastert) {
    init_with_bastert<baryonyx::itm::default_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)local_3d0,original_costs,variables,0);
  }
  else {
    if (iVar4 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = (pnm_observer *)local_3d0;
      x_optimistic = &local_288;
    }
    else {
      if (iVar4 != optimistic_solve) goto LAB_0048b922;
      rng = this->m_rng;
      x_pessimistic = &local_288;
      x_optimistic = (pnm_observer *)local_3d0;
    }
    init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::minimize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_0048b922:
  local_3a8 = original_costs;
  if (local_3d0._0_4_ != 0) {
    iVar16 = 0;
    do {
      dVar19 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar19 < dVar20) {
        bit_array_impl::invert((bit_array_impl *)local_3d0,iVar16);
      }
      iVar16 = iVar16 + 1;
    } while (local_3d0._0_4_ != iVar16);
  }
  if (local_288.m_pi_obs.m_pnm.m_buffer._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
    operator_delete__((void *)local_288.m_pi_obs.m_pnm.m_buffer._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  local_3e0 = (ctx->parameters).kappa_min;
  filename._M_str = "img";
  filename._M_len = 3;
  pnm_observer::pnm_observer(&local_288,filename,local_318.m,local_318.n,(ctx->parameters).limit);
  rVar13 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar13;
  rVar13 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar13;
  compute_order::
  init<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array>
            (&local_350,&local_318,(bit_array *)local_3d0);
  if ((ctx->parameters).limit != 0) {
    iVar16 = 0x7fffffff;
    lVar17 = 0;
    while( true ) {
      iVar10 = compute_order::
               run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                         (&local_350,&local_318,(bit_array *)local_3d0,this->m_rng,local_3e0,
                          (double)local_3b0,local_3b8);
      uVar9._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)local_318.pi;
      P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)local_318.P;
      details::pi_pnm_observer::make_observation<double>
                (&local_288.m_pi_obs,&local_318.ap,
                 (double *)
                 local_318.P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                 .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl,
                 (double *)
                 local_318.pi._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl);
      details::ap_pnm_observer::make_observation<double>
                (&local_288.m_ap_obs,&local_318.ap,
                 (double *)
                 P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl,
                 (double *)
                 uVar9._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl);
      if (iVar10 == 0) {
        dVar20 = default_cost_type<double>::results(local_3a8,(bit_array *)local_3d0,local_3a0);
        store_if_better(this,(bit_array *)local_3d0,dVar20,lVar17);
        if ((ctx->parameters).pushes_limit < 1) goto LAB_0048bb29;
        iVar16 = 0;
        iVar10 = 0;
        goto LAB_0048bc67;
      }
      if (iVar10 < iVar16) {
        store_if_better(this,(bit_array *)local_3d0,iVar10,lVar17);
        iVar16 = iVar10;
      }
      if (local_358 < lVar17) {
        auVar22._0_8_ = pow((double)iVar10 / (double)local_318.m,local_390);
        auVar22._8_56_ = extraout_var;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = local_3e0;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_388;
        auVar18 = vfmadd231sd_fma(auVar24,auVar22._0_16_,auVar2);
        local_3e0 = auVar18._0_8_;
      }
      if (local_380 < local_3e0) break;
      lVar14 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar14;
      dVar20 = (this->m_ctx->parameters).time_limit;
      if (((0.0 < dVar20) && (dVar20 < (double)(lVar14 - (this->m_begin).__d.__r) / 1000000000.0))
         || (lVar17 = lVar17 + 1, lVar17 == (ctx->parameters).limit)) break;
    }
  }
  *(result_status *)(local_3d0._16_8_ + 0xa0) = limit_reached;
LAB_0048bb29:
  iVar16 = local_394;
  if ((this->m_best).remaining_constraints == 0) {
    *(result_status *)(local_3d0._16_8_ + 0xa0) = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    this_00 = (vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
              (local_3d0._16_8_ + 0x68);
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(this_00,1);
    convert<baryonyx::itm::minimize_tag>
              (&this->m_best,
               (this_00->super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
               )._M_impl.super__Vector_impl_data._M_start,iVar16);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_ap_obs.m_basename._M_dataplus._M_p != &local_288.m_ap_obs.m_basename.field_2) {
    operator_delete(local_288.m_ap_obs.m_basename._M_dataplus._M_p,
                    local_288.m_ap_obs.m_basename.field_2._M_allocated_capacity + 1);
  }
  pnm_vector::~pnm_vector(&local_288.m_pi_obs.m_pnm);
  if (local_350.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_350.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_350.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_350.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_350.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_350.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_350.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_350.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  ::~solver_inequalities_101coeff(&local_318);
  if ((_Head_base<0UL,_double_*,_false>)
      local_378.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_double_*,_false>)0x0)
  {
    operator_delete__((void *)local_378.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if ((unsigned_long *)local_3d0._8_8_ != (unsigned_long *)0x0) {
    operator_delete__((void *)local_3d0._8_8_);
  }
  return (result *)local_3d0._16_8_;
LAB_0048bc67:
  do {
    iVar11 = compute_order::
             push_and_run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                       (&local_350,&local_318,(bit_array *)local_3d0,this->m_rng,
                        local_3e0 * local_360,(double)local_3b0,local_3b8,local_368);
    if (iVar11 == 0) {
      dVar20 = default_cost_type<double>::results(local_3a8,(bit_array *)local_3d0,local_3a0);
      store_if_better(this,(bit_array *)local_3d0,dVar20,
                      (long)~((ctx->parameters).pushing_iteration_limit * iVar10));
    }
    lVar17 = std::chrono::_V2::steady_clock::now();
    (this->m_end).__d.__r = lVar17;
    dVar20 = (this->m_ctx->parameters).time_limit;
    if ((0.0 < dVar20) && (dVar20 < (double)(lVar17 - (this->m_begin).__d.__r) / 1000000000.0))
    break;
    if (0 < (ctx->parameters).pushing_iteration_limit) {
      iVar11 = 1;
      while (iVar12 = compute_order::
                      run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                                (&local_350,&local_318,(bit_array *)local_3d0,this->m_rng,local_3e0,
                                 (double)local_3b0,local_3b8), iVar12 != 0) {
        if ((ctx->parameters).w < (double)(iVar11 + -1)) {
          auVar21._0_8_ = pow((double)iVar12 / (double)local_318.m,local_390);
          auVar21._8_56_ = extraout_var_00;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_3e0;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_388;
          auVar18 = vfmadd231sd_fma(auVar25,auVar21._0_16_,auVar3);
          local_3e0 = auVar18._0_8_;
        }
        if (local_380 < local_3e0) goto LAB_0048be2a;
        lVar17 = std::chrono::_V2::steady_clock::now();
        (this->m_end).__d.__r = lVar17;
        dVar20 = (this->m_ctx->parameters).time_limit;
        if (((0.0 < dVar20) && (dVar20 < (double)(lVar17 - (this->m_begin).__d.__r) / 1000000000.0))
           || (bVar5 = (ctx->parameters).pushing_iteration_limit <= iVar11, iVar11 = iVar11 + 1,
              bVar5)) goto LAB_0048be2a;
      }
      dVar20 = default_cost_type<double>::results(local_3a8,(bit_array *)local_3d0,local_3a0);
      store_if_better(this,(bit_array *)local_3d0,dVar20,
                      (long)((ctx->parameters).pushing_iteration_limit * iVar16 - iVar11));
    }
LAB_0048be2a:
    iVar10 = iVar10 + 1;
    iVar16 = iVar16 + -1;
  } while (iVar10 < (ctx->parameters).pushes_limit);
  goto LAB_0048bb29;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }